

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FramebufferBase.hpp
# Opt level: O0

ITextureView * __thiscall
Diligent::FramebufferBase<Diligent::EngineVkImplTraits>::GetReadOnlyDSV
          (FramebufferBase<Diligent::EngineVkImplTraits> *this,Uint32 Subpass)

{
  int iVar1;
  undefined4 extraout_var;
  Char *Message;
  char (*in_R8) [19];
  ITextureView *local_68;
  undefined1 local_38 [8];
  string msg;
  Uint32 Subpass_local;
  FramebufferBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._12_4_ = Subpass;
  iVar1 = (*(((this->
              super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
              ).m_Desc.pRenderPass)->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  if (*(uint *)(CONCAT44(extraout_var,iVar1) + 0x18) <= Subpass) {
    FormatString<char[16],unsigned_int,char[19]>
              ((string *)local_38,(Diligent *)"Subpass index (",
               (char (*) [16])((long)&msg.field_2 + 0xc),(uint *)") is out of range.",in_R8);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetReadOnlyDSV",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/FramebufferBase.hpp"
               ,199);
    std::__cxx11::string::~string((string *)local_38);
  }
  if (this->m_ppReadOnlyDSVs == (ITextureView **)0x0) {
    local_68 = (ITextureView *)0x0;
  }
  else {
    local_68 = this->m_ppReadOnlyDSVs[(uint)msg.field_2._12_4_];
  }
  return local_68;
}

Assistant:

ITextureView* GetReadOnlyDSV(Uint32 Subpass) const
    {
        VERIFY(Subpass < this->m_Desc.pRenderPass->GetDesc().SubpassCount, "Subpass index (", Subpass, ") is out of range.");
        return m_ppReadOnlyDSVs != nullptr ?
            m_ppReadOnlyDSVs[Subpass] :
            nullptr;
    }